

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
                 *handler)

{
  type tVar1;
  int iVar2;
  char *begin_00;
  char *local_20;
  precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
  local_18;
  
  local_20 = begin + 1;
  if (local_20 != end) {
    if ((int)*local_20 - 0x30U < 10) {
      iVar2 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                        (&local_20,end,handler);
      ((handler->
       super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
       ).super_specs_setter<char>.specs_)->precision = iVar2;
    }
    else {
      if (*local_20 != '{') goto LAB_00618fe2;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_18.handler = handler;
        begin_00 = parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>>
                             (begin_00,end,&local_18);
      }
      if ((begin_00 == end) || (local_20 = begin_00 + 1, *begin_00 != '}')) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
                   ).context_,"invalid format string");
      }
    }
    tVar1 = (handler->checker_).arg_type_;
    if ((tVar1 < custom_type) && ((0x41feU >> (tVar1 & 0x1f) & 1) != 0)) {
      error_handler::on_error
                ((error_handler *)((handler->checker_).error_handler_)->context_,
                 "precision not allowed for this argument type");
    }
    return local_20;
  }
LAB_00618fe2:
  error_handler::on_error
            ((error_handler *)
             (handler->
             super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
             ).context_,"missing precision specifier");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}